

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_new_std_file(JSContext *ctx,FILE *f,BOOL close_in_finalizer,BOOL is_popen)

{
  JSValue v;
  JSValue JVar1;
  int iVar2;
  undefined8 *opaque;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  JSValue JVar3;
  JSValue obj;
  JSSTDFile *s;
  int in_stack_ffffffffffffffac;
  JSContext *in_stack_ffffffffffffffb0;
  JSValueUnion ctx_00;
  JSValueUnion JVar4;
  JSValueUnion size;
  int32_t local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  JVar3 = JS_NewObjectClass(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  ctx_00 = JVar3.u;
  JVar4 = (JSValueUnion)JVar3.tag;
  size = ctx_00;
  local_8 = JVar4;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    opaque = (undefined8 *)js_mallocz((JSContext *)local_8.ptr,(size_t)size);
    if (opaque == (undefined8 *)0x0) {
      v.tag = (int64_t)size.ptr;
      v.u.ptr = JVar4.ptr;
      JS_FreeValue((JSContext *)ctx_00.ptr,v);
      local_10 = 0;
      local_8.float64 = 2.96439387504748e-323;
    }
    else {
      *(undefined4 *)(opaque + 1) = in_EDX;
      *(undefined4 *)((long)opaque + 0xc) = in_ECX;
      *opaque = in_RSI;
      JVar3.tag = (int64_t)local_8.ptr;
      JVar3.u.float64 = size.float64;
      JS_SetOpaque(JVar3,opaque);
      local_10 = size.int32;
      uStack_c = size._4_4_;
    }
  }
  else {
    local_10 = size.int32;
    uStack_c = size._4_4_;
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue js_new_std_file(JSContext *ctx, FILE *f,
                               BOOL close_in_finalizer,
                               BOOL is_popen)
{
    JSSTDFile *s;
    JSValue obj;
    obj = JS_NewObjectClass(ctx, js_std_file_class_id);
    if (JS_IsException(obj))
        return obj;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    s->close_in_finalizer = close_in_finalizer;
    s->is_popen = is_popen;
    s->f = f;
    JS_SetOpaque(obj, s);
    return obj;
}